

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# words.c
# Opt level: O0

void update_error_limit(words_data *w,uint32_t flags)

{
  int32_t iVar1;
  uint uVar2;
  uint log;
  int iVar3;
  uint in_ESI;
  int *in_RDI;
  int balance;
  int slow_log_1;
  int slow_log_0_1;
  int bitrate_1;
  int slow_log_0;
  int bitrate_0;
  int in_stack_ffffffffffffffe0;
  uint local_18;
  uint local_10;
  
  iVar3 = in_RDI[2];
  in_RDI[2] = *in_RDI + iVar3;
  local_10 = (uint)(*in_RDI + iVar3) >> 0x10;
  if ((in_ESI & 0x40000004) == 0) {
    iVar3 = in_RDI[3];
    in_RDI[3] = in_RDI[1] + iVar3;
    local_18 = (uint)(in_RDI[1] + iVar3) >> 0x10;
    if ((in_ESI & 0x200) == 0) {
      iVar1 = exp2s(in_stack_ffffffffffffffe0);
      in_RDI[0xd] = iVar1;
      iVar1 = exp2s(in_stack_ffffffffffffffe0);
      in_RDI[0x12] = iVar1;
    }
    else {
      uVar2 = in_RDI[0xc] + 0x80U >> 8;
      log = in_RDI[0x11] + 0x80U >> 8;
      if ((in_ESI & 0x400) != 0) {
        iVar3 = (int)((log - uVar2) + local_18 + 1) >> 1;
        if ((int)local_10 < iVar3) {
          local_18 = local_10 << 1;
          local_10 = 0;
        }
        else if ((int)local_10 < -iVar3) {
          local_10 = local_10 << 1;
          local_18 = 0;
        }
        else {
          local_18 = local_10 + iVar3;
          local_10 = local_10 - iVar3;
        }
      }
      if ((int)(uVar2 - local_10) < -0xff) {
        in_RDI[0xd] = 0;
      }
      else {
        iVar1 = exp2s(log);
        in_RDI[0xd] = iVar1;
      }
      if ((int)(log - local_18) < -0xff) {
        in_RDI[0x12] = 0;
      }
      else {
        iVar1 = exp2s(log);
        in_RDI[0x12] = iVar1;
      }
    }
  }
  else if ((in_ESI & 0x200) == 0) {
    iVar1 = exp2s(in_stack_ffffffffffffffe0);
    in_RDI[0xd] = iVar1;
  }
  else if ((int)((in_RDI[0xc] + 0x80U >> 8) - local_10) < -0xff) {
    in_RDI[0xd] = 0;
  }
  else {
    iVar1 = exp2s(in_stack_ffffffffffffffe0);
    in_RDI[0xd] = iVar1;
  }
  return;
}

Assistant:

void update_error_limit (struct words_data *w, uint32_t flags)
{
    int bitrate_0 = (w->bitrate_acc [0] += w->bitrate_delta [0]) >> 16;

    if (flags & MONO_DATA) {
        if (flags & HYBRID_BITRATE) {
            int slow_log_0 = (w->c [0].slow_level + SLO) >> SLS;

            if (slow_log_0 - bitrate_0 > -0x100)
                w->c [0].error_limit = exp2s (slow_log_0 - bitrate_0 + 0x100);
            else
                w->c [0].error_limit = 0;
        }
        else
            w->c [0].error_limit = exp2s (bitrate_0);
    }
    else {
        int bitrate_1 = (w->bitrate_acc [1] += w->bitrate_delta [1]) >> 16;

        if (flags & HYBRID_BITRATE) {
            int slow_log_0 = (w->c [0].slow_level + SLO) >> SLS;
            int slow_log_1 = (w->c [1].slow_level + SLO) >> SLS;

            if (flags & HYBRID_BALANCE) {
                int balance = (slow_log_1 - slow_log_0 + bitrate_1 + 1) >> 1;

                if (balance > bitrate_0) {
                    bitrate_1 = bitrate_0 * 2;
                    bitrate_0 = 0;
                }
                else if (-balance > bitrate_0) {
                    bitrate_0 = bitrate_0 * 2;
                    bitrate_1 = 0;
                }
                else {
                    bitrate_1 = bitrate_0 + balance;
                    bitrate_0 = bitrate_0 - balance;
                }
            }

            if (slow_log_0 - bitrate_0 > -0x100)
                w->c [0].error_limit = exp2s (slow_log_0 - bitrate_0 + 0x100);
            else
                w->c [0].error_limit = 0;

            if (slow_log_1 - bitrate_1 > -0x100)
                w->c [1].error_limit = exp2s (slow_log_1 - bitrate_1 + 0x100);
            else
                w->c [1].error_limit = 0;
        }
        else {
            w->c [0].error_limit = exp2s (bitrate_0);
            w->c [1].error_limit = exp2s (bitrate_1);
        }
    }
}